

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmValue * CompileVmArraySetup(ExpressionContext *ctx,VmModule *module,ExprArraySetup *node)

{
  _func_int *p_Var1;
  SynBase *pSVar2;
  Allocator *pAVar3;
  int iVar4;
  TypeBase *pTVar5;
  VmValue *pVVar6;
  VmValue *pVVar7;
  VmConstant *address;
  VmBlock *block;
  VmBlock *block_00;
  VmBlock *block_01;
  VmConstant *pVVar8;
  VmValue *pVVar9;
  TypeRef *structType;
  undefined4 extraout_var;
  uint offset;
  _func_int **pp_Var10;
  
  pTVar5 = node->lhs->type;
  if ((pTVar5 == (TypeBase *)0x0) || (pTVar5->typeID != 0x12)) {
    pTVar5 = (TypeBase *)0x0;
  }
  if (pTVar5 == (TypeBase *)0x0) {
    __assert_fail("refType",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xdb8,
                  "VmValue *CompileVmArraySetup(ExpressionContext &, VmModule *, ExprArraySetup *)")
    ;
  }
  pp_Var10 = pTVar5[1]._vptr_TypeBase;
  if ((pp_Var10 == (_func_int **)0x0) || (*(int *)(pp_Var10 + 1) != 0x13)) {
    pp_Var10 = (_func_int **)0x0;
  }
  if (pp_Var10 != (_func_int **)0x0) {
    pVVar6 = CompileVm(ctx,module,node->initializer);
    pVVar7 = CompileVm(ctx,module,node->lhs);
    p_Var1 = pp_Var10[0xc];
    if ((p_Var1 == (_func_int *)0x0) || (6 < *(int *)(p_Var1 + 8) - 2U)) {
      address = anon_unknown.dwarf_13465d::CreateAlloca
                          (ctx,module,(node->super_ExprBase).source,ctx->typeInt,"arr_it",true);
      block = anon_unknown.dwarf_13465d::CreateBlock
                        (module,(node->super_ExprBase).source,"arr_setup_cond");
      block_00 = anon_unknown.dwarf_13465d::CreateBlock
                           (module,(node->super_ExprBase).source,"arr_setup_body");
      block_01 = anon_unknown.dwarf_13465d::CreateBlock
                           (module,(node->super_ExprBase).source,"arr_setup_exit");
      pSVar2 = (node->super_ExprBase).source;
      pTVar5 = ctx->typeInt;
      pVVar8 = CreateConstantInt(module->allocator,pSVar2,0);
      anon_unknown.dwarf_13465d::CreateStore
                (ctx,module,pSVar2,pTVar5,&address->super_VmValue,&pVVar8->super_VmValue,0);
      offset = (uint)pVVar8;
      anon_unknown.dwarf_13465d::CreateJump
                (module,(node->super_ExprBase).source,&block->super_VmValue);
      VmFunction::AddBlock(module->currentFunction,block);
      module->currentBlock = block;
      if ((long)(int)(*(long *)(pp_Var10[0xc] + 0x30) * (long)pp_Var10[0xd]) !=
          *(long *)(pp_Var10[0xc] + 0x30) * (long)pp_Var10[0xd]) {
        __assert_fail("int(arrayType->length * arrayType->subType->size) == arrayType->length * arrayType->subType->size"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0xdd6,
                      "VmValue *CompileVmArraySetup(ExpressionContext &, VmModule *, ExprArraySetup *)"
                     );
      }
      pSVar2 = (node->super_ExprBase).source;
      pVVar9 = anon_unknown.dwarf_13465d::CreateLoad
                         (ctx,module,pSVar2,ctx->typeInt,&address->super_VmValue,offset);
      pVVar8 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,
                                 *(int *)(pp_Var10[0xc] + 0x30) * *(int *)(pp_Var10 + 0xd));
      pVVar9 = anon_unknown.dwarf_13465d::CreateCompareLess
                         (module,pSVar2,pVVar9,&pVVar8->super_VmValue);
      anon_unknown.dwarf_13465d::CreateJumpNotZero
                (module,(node->super_ExprBase).source,pVVar9,&block_00->super_VmValue,
                 &block_01->super_VmValue);
      VmFunction::AddBlock(module->currentFunction,block_00);
      module->currentBlock = block_00;
      pVVar9 = anon_unknown.dwarf_13465d::CreateLoad
                         (ctx,module,(node->super_ExprBase).source,ctx->typeInt,
                          &address->super_VmValue,offset);
      pSVar2 = (node->super_ExprBase).source;
      pTVar5 = (TypeBase *)pp_Var10[0xc];
      structType = ExpressionContext::GetReferenceType(ctx,pTVar5);
      pVVar7 = anon_unknown.dwarf_13465d::CreateMemberAccess
                         (module,pSVar2,pVVar7,pVVar9,&structType->super_TypeBase,
                          (InplaceStr)ZEXT816(0));
      anon_unknown.dwarf_13465d::CreateStore(ctx,module,pSVar2,pTVar5,pVVar7,pVVar6,0);
      pSVar2 = (node->super_ExprBase).source;
      pTVar5 = ctx->typeInt;
      pVVar8 = CreateConstantInt(module->allocator,pSVar2,*(int *)(pp_Var10[0xc] + 0x30));
      pVVar6 = anon_unknown.dwarf_13465d::CreateAdd(module,pSVar2,pVVar9,&pVVar8->super_VmValue);
      anon_unknown.dwarf_13465d::CreateStore
                (ctx,module,pSVar2,pTVar5,&address->super_VmValue,pVVar6,0);
      anon_unknown.dwarf_13465d::CreateJump
                (module,(node->super_ExprBase).source,&block->super_VmValue);
      VmFunction::AddBlock(module->currentFunction,block_01);
      module->currentBlock = block_01;
      iVar4 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0x98);
      pVVar6 = (VmValue *)CONCAT44(extraout_var,iVar4);
      pAVar3 = module->allocator;
      pVVar6->typeID = 0;
      pVVar6->source = (SynBase *)0x0;
      (pVVar6->comment).begin = (char *)0x0;
      (pVVar6->type).type = VM_TYPE_VOID;
      (pVVar6->type).size = 0;
      (pVVar6->type).structType = (TypeBase *)0x0;
      (pVVar6->comment).end = (char *)0x0;
      (pVVar6->users).allocator = pAVar3;
      (pVVar6->users).data = (pVVar6->users).little;
      (pVVar6->users).count = 0;
      (pVVar6->users).max = 8;
      pVVar6->hasSideEffects = false;
      pVVar6->hasMemoryAccess = false;
      pVVar6->canBeRemoved = true;
      pVVar6->hasKnownSimpleUse = false;
      pVVar6->hasKnownNonSimpleUse = false;
      pVVar6->_vptr_VmValue = (_func_int **)&PTR__VmValue_00249c60;
    }
    else {
      pVVar6 = anon_unknown.dwarf_13465d::CreateSetRange
                         (module,(node->super_ExprBase).source,pVVar7,*(int *)(pp_Var10 + 0xd),
                          pVVar6,*(int *)(p_Var1 + 0x30));
    }
    anon_unknown.dwarf_13465d::CheckType(ctx,&node->super_ExprBase,pVVar6);
    return pVVar6;
  }
  __assert_fail("arrayType",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0xdbc,
                "VmValue *CompileVmArraySetup(ExpressionContext &, VmModule *, ExprArraySetup *)");
}

Assistant:

VmValue* CompileVmArraySetup(ExpressionContext &ctx, VmModule *module, ExprArraySetup *node)
{
	TypeRef *refType = getType<TypeRef>(node->lhs->type);

	assert(refType);

	TypeArray *arrayType = getType<TypeArray>(refType->subType);

	assert(arrayType);

	VmValue *initializer = CompileVm(ctx, module, node->initializer);

	VmValue *address = CompileVm(ctx, module, node->lhs);

	TypeBase *elementType = arrayType->subType;

	// Fast memset for supported types
	if(isType<TypeBool>(elementType) || isType<TypeChar>(elementType) || isType<TypeShort>(elementType) || isType<TypeInt>(elementType) || isType<TypeLong>(elementType) || isType<TypeFloat>(elementType) || isType<TypeDouble>(elementType))
		return CheckType(ctx, node, CreateSetRange(module, node->source, address, int(arrayType->length), initializer, int(elementType->size)));

	VmValue *offsetPtr = CreateAlloca(ctx, module, node->source, ctx.typeInt, "arr_it", true);

	VmBlock *conditionBlock = CreateBlock(module, node->source, "arr_setup_cond");
	VmBlock *bodyBlock = CreateBlock(module, node->source, "arr_setup_body");
	VmBlock *exitBlock = CreateBlock(module, node->source, "arr_setup_exit");

	CreateStore(ctx, module, node->source, ctx.typeInt, offsetPtr, CreateConstantInt(module->allocator, node->source, 0), 0);

	CreateJump(module, node->source, conditionBlock);

	module->currentFunction->AddBlock(conditionBlock);
	module->currentBlock = conditionBlock;

	// Offset will move in element size steps, so it will reach the full size of the array
	assert(int(arrayType->length * arrayType->subType->size) == arrayType->length * arrayType->subType->size);

	// While offset is less than array size
	VmValue* condition = CreateCompareLess(module, node->source, CreateLoad(ctx, module, node->source, ctx.typeInt, offsetPtr, 0), CreateConstantInt(module->allocator, node->source, int(arrayType->length * arrayType->subType->size)));

	CreateJumpNotZero(module, node->source, condition, bodyBlock, exitBlock);

	module->currentFunction->AddBlock(bodyBlock);
	module->currentBlock = bodyBlock;

	VmValue *offset = CreateLoad(ctx, module, node->source, ctx.typeInt, offsetPtr, 0);

	CreateStore(ctx, module, node->source, arrayType->subType, CreateMemberAccess(module, node->source, address, offset, ctx.GetReferenceType(arrayType->subType), InplaceStr()), initializer, 0);
	CreateStore(ctx, module, node->source, ctx.typeInt, offsetPtr, CreateAdd(module, node->source, offset, CreateConstantInt(module->allocator, node->source, int(arrayType->subType->size))), 0);

	CreateJump(module, node->source, conditionBlock);

	module->currentFunction->AddBlock(exitBlock);
	module->currentBlock = exitBlock;

	return CheckType(ctx, node, CreateVoid(module));
}